

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O0

char * get_ptypes(short *S,vrna_md_t *md,uint idx_type)

{
  short sVar1;
  uint uVar2;
  uint idx_type_local;
  vrna_md_t *md_local;
  short *S_local;
  
  if (S == (short *)0x0) {
    S_local = (short *)0x0;
  }
  else {
    sVar1 = *S;
    uVar2 = vrna_sequence_length_max(0);
    if (uVar2 < (uint)(int)sVar1) {
      vrna_message_warning
                ("get_ptypes@alphabet.c: sequence length of %d exceeds addressable range",
                 (ulong)(uint)(int)*S);
      S_local = (short *)0x0;
    }
    else if (idx_type == 0) {
      S_local = (short *)vrna_ptypes(S,md);
    }
    else {
      S_local = (short *)wrap_get_ptypes(S,md);
    }
  }
  return (char *)S_local;
}

Assistant:

PUBLIC char *
get_ptypes(const short  *S,
           vrna_md_t    *md,
           unsigned int idx_type)
{
  if (S) {
    if ((unsigned int)S[0] > vrna_sequence_length_max(VRNA_OPTION_DEFAULT)) {
      vrna_message_warning("get_ptypes@alphabet.c: sequence length of %d exceeds addressable range",
                           (int)S[0]);
      return NULL;
    }

    if (idx_type)
      return wrap_get_ptypes(S, md);
    else
      return vrna_ptypes(S, md);
  } else {
    return NULL;
  }
}